

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::AssetPath> *this,double t)

{
  Sample local_68;
  
  local_68.value.asset_path_._M_dataplus._M_p = (pointer)&local_68.value.asset_path_.field_2;
  local_68.value.asset_path_._M_string_length = 0;
  local_68.value.asset_path_.field_2._M_local_buf[0] = '\0';
  local_68.value.resolved_path_._M_dataplus._M_p = (pointer)&local_68.value.resolved_path_.field_2;
  local_68.value.resolved_path_._M_string_length = 0;
  local_68.value.resolved_path_.field_2._M_local_buf[0] = '\0';
  local_68.blocked = true;
  local_68.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
              *)this,&local_68);
  this->_dirty = true;
  tinyusdz::value::AssetPath::~AssetPath(&local_68.value);
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }